

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O0

int checkivError(GLuint object,GLenum pname,PFNGLGETPROGRAMIVPROC glGetiv,
                PFNGLGETPROGRAMINFOLOGPROC glGetInfoLog)

{
  GLchar *__ptr;
  char *log;
  GLint logsize;
  GLint compile_status;
  PFNGLGETPROGRAMINFOLOGPROC glGetInfoLog_local;
  PFNGLGETPROGRAMIVPROC glGetiv_local;
  GLuint local_10;
  GLenum pname_local;
  GLuint object_local;
  
  log._4_4_ = 1;
  _logsize = glGetInfoLog;
  glGetInfoLog_local = (PFNGLGETPROGRAMINFOLOGPROC)glGetiv;
  glGetiv_local._4_4_ = pname;
  local_10 = object;
  (*glGetiv)(object,pname,(GLint *)((long)&log + 4));
  if (log._4_4_ == 1) {
    pname_local = 0;
  }
  else {
    (*glGetInfoLog_local)(local_10,0x8b84,(GLsizei *)&log,(GLchar *)glGetInfoLog);
    __ptr = (GLchar *)malloc((long)(int)log + 1);
    if (__ptr == (GLchar *)0x0) {
      bov_error_log(0x30001,"Memory allocation failed");
      fprintf(_stderr,"\t(in function %s, line %d)\n","checkivError",0x7d);
      exit(1);
    }
    (*_logsize)(local_10,(int)log,(GLsizei *)&log,__ptr);
    if (glGetiv_local._4_4_ == 0x8b82) {
      bov_error_log(0x20002,"%s\t-> link operation failed",__ptr);
      fprintf(_stderr,"\t(in function %s, line %d)\n","checkivError",0x83);
    }
    else if (glGetiv_local._4_4_ == 0x8b81) {
      bov_error_log(0x20002,"%s\t-> compile operation failed",__ptr);
      fprintf(_stderr,"\t(in function %s, line %d)\n","checkivError",0x87);
    }
    else {
      bov_error_log(0x20002,"%s\t-> Unknown object operation failed",__ptr);
      fprintf(_stderr,"\t(in function %s, line %d)\n","checkivError",0x8b);
    }
    free(__ptr);
    pname_local = 0x20002;
  }
  return pname_local;
}

Assistant:

static int checkivError(GLuint object, GLenum pname,
                        PFNGLGETPROGRAMIVPROC glGetiv,
                        PFNGLGETPROGRAMINFOLOGPROC glGetInfoLog)
{
	GLint compile_status = GL_TRUE;
	glGetiv(object, pname, &compile_status);
	if(compile_status!=GL_TRUE)
	{
		GLint logsize;
		glGetiv(object, GL_INFO_LOG_LENGTH, &logsize);

		char *log = malloc((size_t) logsize + 1);
		CHECK_MALLOC(log);

		glGetInfoLog(object, logsize, &logsize, log);
		if(pname==GL_LINK_STATUS)
			BOV_ERROR_LOG(BOV_SHADER_ERROR,
			              "%s\t-> link operation failed",
			              log);
		else if(pname==GL_COMPILE_STATUS)
			BOV_ERROR_LOG(BOV_SHADER_ERROR,
			              "%s\t-> compile operation failed",
			              log);
		else
			BOV_ERROR_LOG(BOV_SHADER_ERROR,
			              "%s\t-> Unknown object operation failed",
			              log);
		free(log);
		return BOV_SHADER_ERROR;
	}
	return 0;
}